

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMessageTest_ExplicitSyntaxIdentifier_Test::TestBody
          (ParseMessageTest_ExplicitSyntaxIdentifier_Test *this)

{
  Parser *pPVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  internal local_18 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  ParserTest::ExpectParsesTo
            (&this->super_ParseMessageTest,
             "syntax = \"proto2\";\nmessage TestMessage {\n  required int32 foo = 1;\n}\n",
             "syntax: \'proto2\' message_type {  name: \"TestMessage\"  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }}"
            );
  pPVar1 = (this->super_ParseMessageTest).parser_._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::Parser_*,_std::default_delete<google::protobuf::compiler::Parser>_>
           .super__Head_base<0UL,_google::protobuf::compiler::Parser_*,_false>._M_head_impl;
  local_28._M_str = (pPVar1->syntax_identifier_)._M_dataplus._M_p;
  local_28._M_len = (pPVar1->syntax_identifier_)._M_string_length;
  testing::internal::CmpHelperEQ<char[7],std::basic_string_view<char,std::char_traits<char>>>
            (local_18,"\"proto2\"","parser_->GetSyntaxIdentifier()",(char (*) [7])0x12499be,
             &local_28);
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_10->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0x13f,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((long *)local_28._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_28._M_len + 8))();
    }
  }
  if (local_10 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_10,local_10);
  }
  return;
}

Assistant:

TEST_F(ParseMessageTest, ExplicitSyntaxIdentifier) {
  ExpectParsesTo(
      "syntax = \"proto2\";\n"
      "message TestMessage {\n"
      "  required int32 foo = 1;\n"
      "}\n",

      "syntax: 'proto2' "
      "message_type {"
      "  name: \"TestMessage\""
      "  field { name:\"foo\" label:LABEL_REQUIRED type:TYPE_INT32 number:1 }"
      "}");
  EXPECT_EQ("proto2", parser_->GetSyntaxIdentifier());
}